

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base64.c
# Opt level: O0

CURLcode Curl_base64_decode(char *src,uchar **outptr,size_t *outlen)

{
  size_t sVar1;
  char *pcVar2;
  size_t sVar3;
  uchar *puVar4;
  size_t sVar5;
  size_t result;
  uchar *newstr;
  uchar *pos;
  char *padptr;
  size_t rawlen;
  size_t numQuantums;
  size_t i;
  size_t padding;
  size_t srclen;
  size_t *outlen_local;
  uchar **outptr_local;
  char *src_local;
  
  i = 0;
  *outptr = (uchar *)0x0;
  *outlen = 0;
  sVar1 = strlen(src);
  if ((sVar1 == 0) || ((sVar1 & 3) != 0)) {
    src_local._4_4_ = CURLE_BAD_CONTENT_ENCODING;
  }
  else {
    pcVar2 = strchr(src,0x3d);
    if (pcVar2 != (char *)0x0) {
      i = 1;
      if (pcVar2[1] == '=') {
        i = 2;
      }
      if (pcVar2 + i != src + sVar1) {
        return CURLE_BAD_CONTENT_ENCODING;
      }
    }
    sVar3 = (sVar1 >> 2) * 3 - i;
    puVar4 = (uchar *)(*Curl_cmalloc)(sVar3 + 1);
    if (puVar4 == (uchar *)0x0) {
      src_local._4_4_ = CURLE_OUT_OF_MEMORY;
    }
    else {
      newstr = puVar4;
      outptr_local = (uchar **)src;
      for (numQuantums = 0; numQuantums < sVar1 >> 2; numQuantums = numQuantums + 1) {
        sVar5 = decodeQuantum(newstr,(char *)outptr_local);
        if (sVar5 == 0) {
          (*Curl_cfree)(puVar4);
          return CURLE_BAD_CONTENT_ENCODING;
        }
        newstr = newstr + sVar5;
        outptr_local = (uchar **)((long)outptr_local + 4);
      }
      *newstr = '\0';
      *outptr = puVar4;
      *outlen = sVar3;
      src_local._4_4_ = CURLE_OK;
    }
  }
  return src_local._4_4_;
}

Assistant:

CURLcode Curl_base64_decode(const char *src,
                            unsigned char **outptr, size_t *outlen)
{
  size_t srclen = 0;
  size_t padding = 0;
  size_t i;
  size_t numQuantums;
  size_t rawlen = 0;
  const char *padptr;
  unsigned char *pos;
  unsigned char *newstr;

  *outptr = NULL;
  *outlen = 0;
  srclen = strlen(src);

  /* Check the length of the input string is valid */
  if(!srclen || srclen % 4)
    return CURLE_BAD_CONTENT_ENCODING;

  /* Find the position of any = padding characters */
  padptr = strchr(src, '=');
  if(padptr) {
    padding++;
    /* A maximum of two = padding characters is allowed */
    if(padptr[1] == '=')
      padding++;

    /* Check the = padding characters weren't part way through the input */
    if(padptr + padding != src + srclen)
      return CURLE_BAD_CONTENT_ENCODING;
  }

  /* Calculate the number of quantums */
  numQuantums = srclen / 4;

  /* Calculate the size of the decoded string */
  rawlen = (numQuantums * 3) - padding;

  /* Allocate our buffer including room for a null-terminator */
  newstr = malloc(rawlen + 1);
  if(!newstr)
    return CURLE_OUT_OF_MEMORY;

  pos = newstr;

  /* Decode the quantums */
  for(i = 0; i < numQuantums; i++) {
    size_t result = decodeQuantum(pos, src);
    if(!result) {
      free(newstr);

      return CURLE_BAD_CONTENT_ENCODING;
    }

    pos += result;
    src += 4;
  }

  /* Zero terminate */
  *pos = '\0';

  /* Return the decoded data */
  *outptr = newstr;
  *outlen = rawlen;

  return CURLE_OK;
}